

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

uint gpioHardwareRevision(void)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  char term;
  char buf [512];
  FILE *filp;
  char local_219;
  char local_218 [10];
  undefined1 auStack_20e [510];
  FILE *local_10;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(__stream,"%s %s: \n",pcVar2,"gpioHardwareRevision");
  }
  if (gpioHardwareRevision::rev == 0) {
    piCores = 0;
    local_10 = fopen("/proc/cpuinfo","r");
    if (local_10 != (FILE *)0x0) {
      while (pcVar2 = fgets(local_218,0x200,local_10), pcVar2 != (char *)0x0) {
        if ((piCores == 0) && (iVar1 = strncasecmp("model name",local_218,10), iVar1 == 0)) {
          pcVar2 = strstr(local_218,"ARMv6");
          if (pcVar2 == (char *)0x0) {
            pcVar2 = strstr(local_218,"ARMv7");
            if (pcVar2 == (char *)0x0) {
              pcVar2 = strstr(local_218,"ARMv8");
              if (pcVar2 != (char *)0x0) {
                piCores = 4;
                pi_peri_phys = 0x3f000000;
                pi_dram_bus = 0xc0000000;
                pi_mem_flag = 4;
              }
            }
            else {
              piCores = 4;
              pi_peri_phys = 0x3f000000;
              pi_dram_bus = 0xc0000000;
              pi_mem_flag = 4;
            }
          }
          else {
            piCores = 1;
            pi_peri_phys = 0x20000000;
            pi_dram_bus = 0x40000000;
            pi_mem_flag = 0xc;
          }
        }
        iVar1 = strncasecmp("revision\t:",local_218,10);
        if ((iVar1 == 0) &&
           (iVar1 = __isoc99_sscanf(auStack_20e,"%x%c",&gpioHardwareRevision::rev,&local_219),
           iVar1 == 2)) {
          if (local_219 == '\n') {
            gpioHardwareRevision::rev = gpioHardwareRevision::rev & 0xffffff;
          }
          else {
            gpioHardwareRevision::rev = 0;
          }
        }
      }
      fclose(local_10);
    }
  }
  return gpioHardwareRevision::rev;
}

Assistant:

unsigned gpioHardwareRevision(void)
{
   static unsigned rev = 0;

   FILE * filp;
   char buf[512];
   char term;

   DBG(DBG_USER, "");

   if (rev) return rev;

   piCores = 0;

   filp = fopen ("/proc/cpuinfo", "r");

   if (filp != NULL)
   {
      while (fgets(buf, sizeof(buf), filp) != NULL)
      {
         if (piCores == 0)
         {
            if (!strncasecmp("model name", buf, 10))
            {
               if (strstr (buf, "ARMv6") != NULL)
               {
                  piCores = 1;
                  pi_peri_phys = 0x20000000;
                  pi_dram_bus  = 0x40000000;
                  pi_mem_flag  = 0x0C;
               }
               else if (strstr (buf, "ARMv7") != NULL)
               {
                  piCores = 4;
                  pi_peri_phys = 0x3F000000;
                  pi_dram_bus  = 0xC0000000;
                  pi_mem_flag  = 0x04;
               }
               else if (strstr (buf, "ARMv8") != NULL)
               {
                  piCores = 4;
                  pi_peri_phys = 0x3F000000;
                  pi_dram_bus  = 0xC0000000;
                  pi_mem_flag  = 0x04;
               }
            }
         }

         if (!strncasecmp("revision\t:", buf, 10))
         {
            if (sscanf(buf+10, "%x%c", &rev, &term) == 2)
            {
               if (term != '\n') rev = 0;
               else rev &= 0xFFFFFF; /* mask out warranty bit */
            }
         }
      }

      fclose(filp);
   }
   return rev;
}